

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::BlockStmt::~BlockStmt(BlockStmt *this)

{
  bool bVar1;
  reference ppSVar2;
  Stmt *stmt;
  iterator __end2;
  iterator __begin2;
  vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_> *__range2;
  BlockStmt *this_local;
  
  (this->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__BlockStmt_001e0d60;
  __end2 = std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::begin(&this->Stmts);
  stmt = (Stmt *)std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::end(&this->Stmts);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
                      (&__end2,(__normal_iterator<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
                                *)&stmt);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>
              ::operator*(&__end2);
    if (*ppSVar2 != (Stmt *)0x0) {
      (*((*ppSVar2)->super_Node)._vptr_Node[1])();
    }
    __gnu_cxx::
    __normal_iterator<ast::Stmt_**,_std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>_>::
    operator++(&__end2);
  }
  std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::clear(&this->Stmts);
  std::vector<ast::Stmt_*,_std::allocator<ast::Stmt_*>_>::~vector(&this->Stmts);
  token::Token::~Token(&this->tok);
  Stmt::~Stmt(&this->super_Stmt);
  return;
}

Assistant:

~BlockStmt()
    {
        for(auto stmt : Stmts)
        {
            delete stmt;
            stmt = nullptr;
        }
        Stmts.clear();
    }